

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
Validator_invalidCellMLIdentifiersWithSpecificationHeading_Test::
Validator_invalidCellMLIdentifiersWithSpecificationHeading_Test
          (Validator_invalidCellMLIdentifiersWithSpecificationHeading_Test *this)

{
  Validator_invalidCellMLIdentifiersWithSpecificationHeading_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this =
       &PTR__Validator_invalidCellMLIdentifiersWithSpecificationHeading_Test_001a2350;
  return;
}

Assistant:

TEST(Validator, invalidCellMLIdentifiersWithSpecificationHeading)
{
    const std::vector<std::string> expectedIssues = {
        "Model '9numbernine' does not have a valid name attribute. CellML identifiers must not begin with a European numeric character [0-9].",
        "Component 'try.this' does not have a valid name attribute. CellML identifiers must not contain any characters other than [a-zA-Z0-9_].",
        "Component '' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "Component 'or this' does not have a valid name attribute. CellML identifiers must not contain any characters other than [a-zA-Z0-9_].",
        "Component '' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
    };
    const std::vector<std::string> expectedSpecificationHeadings = {
        "2.1.1.1",
        "2.7.1.1",
        "2.7.1.1",
        "2.7.1.1",
        "2.7.1.1",
    };
    const std::vector<std::string> expectedUrls = {
        "https://cellml-specification.readthedocs.io/en/latest/reference/formal_and_informative/specB01.html?issue=MODEL_NAME_VALUE",
        "https://cellml-specification.readthedocs.io/en/latest/reference/formal_and_informative/specB07.html?issue=COMPONENT_NAME_VALUE",
        "https://cellml-specification.readthedocs.io/en/latest/reference/formal_and_informative/specB07.html?issue=COMPONENT_NAME_VALUE",
        "https://cellml-specification.readthedocs.io/en/latest/reference/formal_and_informative/specB07.html?issue=COMPONENT_NAME_VALUE",
        "https://cellml-specification.readthedocs.io/en/latest/reference/formal_and_informative/specB07.html?issue=COMPONENT_NAME_VALUE",
    };

    libcellml::ValidatorPtr v = libcellml::Validator::create();
    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c3 = libcellml::Component::create();
    libcellml::ComponentPtr c4 = libcellml::Component::create();
    libcellml::ComponentPtr c5 = libcellml::Component::create();

    model->setName("9numbernine");
    c1->setName("try.this");
    c2->setName("");
    c3->setName("or this");
    c4->setName("nice_name");

    model->addComponent(c1);
    model->addComponent(c2);
    model->addComponent(c3);
    model->addComponent(c4);
    model->addComponent(c5);

    v->validateModel(model);

    EXPECT_EQ_ISSUES_SPECIFICATION_HEADINGS_URLS(expectedIssues, expectedSpecificationHeadings, expectedUrls, v);
}